

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O1

char * status_entry(char *key)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  __ssize_t _Var4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *line;
  size_t line_n;
  char *local_48;
  char *local_40;
  size_t local_38;
  
  pcVar6 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = 0;
  local_40 = key;
  __stream = fopen("/proc/self/status","r");
  if (__stream != (FILE *)0x0) {
    pcVar6 = (char *)0x0;
    do {
      _Var4 = getline(&local_48,&local_38,__stream);
      if (_Var4 == -1) break;
      __s = strchr(local_48,0x3a);
      bVar2 = true;
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        *__s = '\0';
        iVar3 = strcmp(local_48,local_40);
        if (iVar3 == 0) {
          do {
            do {
              pcVar7 = __s;
              __s = pcVar7 + 1;
            } while (*__s == ' ');
          } while (*__s == '\t');
          sVar5 = strlen(__s);
          if (1 < sVar5) {
            pcVar7[sVar5] = '\0';
          }
          cVar1 = *__s;
          pcVar7 = local_48;
          while (cVar1 != '\0') {
            cVar1 = *__s;
            __s = __s + 1;
            *pcVar7 = cVar1;
            pcVar6 = local_48;
            pcVar7 = pcVar7 + 1;
          }
          bVar2 = false;
          local_48 = pcVar7;
        }
      }
    } while (bVar2);
  }
  if (pcVar6 == (char *)0x0) {
    free(local_48);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return pcVar6;
}

Assistant:

static char *
status_entry(const char *key)
{
	char *result = NULL;
	char *line = NULL;
	size_t line_n = 0;
	FILE *fp;
	fp = fopen("/proc/self/status", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		char *v;
		v = strchr(line, ':');
		if (!v || *v == '\0')
			continue;
		*v = '\0';
		if (strcmp(line, key) != 0)
			continue;
		++v;
		while (*v == ' ' || *v == '\t')
			++v;
		if (strlen(v) > 1)
			v[strlen(v)-1] = '\0';
		if (*v == '\0')
			goto done;
		result = line;
		while ((*line++ = *v++))
			;
		goto done;
	}
done:
	if (!result)
		free(line);
	if (fp)
		fclose(fp);
	return result;
}